

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleTypeHandler<1UL>::SetAllPropertiesToUndefined
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,bool invalidateFixedFields)

{
  JavascriptLibrary *this_00;
  RecyclableObject *value;
  int local_2c;
  int propertyIndex;
  RecyclableObject *undefined;
  bool invalidateFixedFields_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  this_00 = RecyclableObject::GetLibrary(&instance->super_RecyclableObject);
  value = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  for (local_2c = 0; local_2c < this->propertyCount; local_2c = local_2c + 1) {
    DynamicTypeHandler::SetSlotUnchecked(instance,local_2c,value);
  }
  return;
}

Assistant:

void SimpleTypeHandler<size>::SetAllPropertiesToUndefined(DynamicObject* instance, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.

        // We can ignore invalidateFixedFields, because SimpleTypeHandler doesn't support fixed fields at this point.
        Js::RecyclableObject* undefined = instance->GetLibrary()->GetUndefined();
        for (int propertyIndex = 0; propertyIndex < this->propertyCount; propertyIndex++)
        {
            SetSlotUnchecked(instance, propertyIndex, undefined);
        }
    }